

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O1

int Fra_FraigMiterAssertedOutput(Aig_Man_t *p)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = p->nObjs[3] - p->nRegs;
  if (uVar5 != 0 && p->nRegs <= p->nObjs[3]) {
    uVar1 = p->vCos->nSize;
    uVar3 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    do {
      if (uVar4 == uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar2 = *(Aig_Obj_t **)((long)p->vCos->pArray[uVar3] + 8);
      if ((pAVar2 != (Aig_Obj_t *)((ulong)p->pConst1 ^ 1)) &&
         ((pAVar2 == p->pConst1 ||
          ((((uint)pAVar2 ^ *(uint *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0))
         )) {
        return (int)uVar3;
      }
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  return -1;
}

Assistant:

int Fra_FraigMiterAssertedOutput( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pChild;
    int i;
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
            continue;
        // check if the output is constant 1
        if ( pChild == Aig_ManConst1(p) )
            return i;
        // check if the output can be not constant 0
        if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
            return i;
    }
    return -1;
}